

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation_p.h
# Opt level: O0

void __thiscall QBlendStyleAnimation::~QBlendStyleAnimation(QBlendStyleAnimation *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR_metaObject_00d0df48;
  QImage::~QImage((QImage *)(in_RDI + 0xb));
  QImage::~QImage((QImage *)(in_RDI + 8));
  QImage::~QImage((QImage *)(in_RDI + 5));
  QStyleAnimation::~QStyleAnimation((QStyleAnimation *)0x4c79c4);
  return;
}

Assistant:

class Q_WIDGETS_EXPORT QBlendStyleAnimation : public QStyleAnimation
{
    Q_OBJECT

public:
    enum Type { Transition, Pulse };

    QBlendStyleAnimation(Type type, QObject *target);

    QImage startImage() const;
    void setStartImage(const QImage& image);

    QImage endImage() const;
    void setEndImage(const QImage& image);

    QImage currentImage() const;

protected:
    virtual void updateCurrentTime(int time) override;

private:
    Type _type;
    QImage _start;
    QImage _end;
    QImage _current;
}